

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::ReadV1_TCODE_MESH_OBJECT
          (ON_BinaryArchive *this,ON_Object **ppObject,ON_3dmObjectAttributes *pAttributes)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ON_Mesh *this_00;
  bool bHasTextureCoordinates;
  bool local_12d;
  float local_12c;
  float fStack_128;
  bool bHaveMat;
  ON_2fPoint t;
  unsigned_short uv [2];
  ON_3fVector normal;
  char xyz_1 [3];
  ON_MeshFace *f_1;
  int abcd_1 [4];
  ON_MeshFace *f;
  ushort local_e8;
  ushort local_e6;
  unsigned_short abcd [4];
  ON_3fPoint pt;
  unsigned_short xyz [3];
  double dz;
  double dy;
  double dx;
  ON_3dVector d;
  undefined1 auStack_88 [6];
  bool bHasTexCoords;
  bool bHasVertexNormals;
  ON_BoundingBox bbox;
  ON__INT32 local_50;
  int boolHasTexCoordsAsInt;
  int boolHasVertexNormalsAsInt;
  int face_count;
  int point_count;
  int i;
  ON__INT64 big_value;
  ON__UINT32 tcode;
  bool rc;
  ON_Mesh *mesh;
  ON_3dmObjectAttributes *pAttributes_local;
  ON_Object **ppObject_local;
  ON_BinaryArchive *this_local;
  
  _tcode = (ON_Mesh *)0x0;
  big_value._7_1_ = 0;
  big_value._0_4_ = 0;
  _point_count = 0;
  mesh = (ON_Mesh *)pAttributes;
  pAttributes_local = (ON_3dmObjectAttributes *)ppObject;
  ppObject_local = (ON_Object **)this;
  bVar1 = BeginRead3dmBigChunk(this,(uint *)&big_value,(ON__INT64 *)&point_count);
  if (!bVar1) {
    return false;
  }
  if ((int)big_value == 0x100017) {
    boolHasVertexNormalsAsInt = 0;
    boolHasTexCoordsAsInt = 0;
    local_50 = 0;
    bbox.m_max.z._4_4_ = 0;
    ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)auStack_88);
    bVar1 = ReadInt(this,&boolHasVertexNormalsAsInt);
    if (((((bVar1) && (0 < boolHasVertexNormalsAsInt)) &&
         (bVar1 = ReadInt(this,&boolHasTexCoordsAsInt), bVar1)) &&
        ((0 < boolHasTexCoordsAsInt && (bVar1 = ReadInt(this,&local_50), bVar1)))) &&
       ((bVar1 = ReadInt(this,(ON__INT32 *)((long)&bbox.m_max.z + 4)), bVar1 &&
        ((bVar1 = ReadPoint(this,(ON_3dPoint *)auStack_88), bVar1 &&
         (bVar1 = ReadPoint(this,(ON_3dPoint *)&bbox.m_min.z), bVar1)))))) {
      bVar1 = local_50 != 0;
      bHasTextureCoordinates = bbox.m_max.z._4_4_ != 0;
      this_00 = (ON_Mesh *)operator_new(0x6e0);
      ON_Mesh::ON_Mesh(this_00,boolHasTexCoordsAsInt,boolHasVertexNormalsAsInt,bVar1,
                       bHasTextureCoordinates);
      _tcode = this_00;
      ON_BoundingBox::Diagonal((ON_3dVector *)&dx,(ON_BoundingBox *)auStack_88);
      face_count = 0;
      while ((face_count < boolHasVertexNormalsAsInt &&
             (bVar2 = ReadShort(this,3,(ON__UINT16 *)((long)&pt.y + 2)), bVar2))) {
        abcd._0_4_ = (undefined4)((dx / 65535.0) * (double)pt.y._2_2_ + _auStack_88);
        abcd._4_4_ = (undefined4)((d.x / 65535.0) * (double)pt.z._0_2_ + bbox.m_min.x);
        pt.x = (float)((d.y / 65535.0) * (double)pt.z._2_2_ + bbox.m_min.y);
        ON_SimpleArray<ON_3fPoint>::Append
                  (&(_tcode->m_V).super_ON_SimpleArray<ON_3fPoint>,(ON_3fPoint *)abcd);
        face_count = face_count + 1;
      }
      iVar3 = ON_SimpleArray<ON_3fPoint>::Count(&(_tcode->m_V).super_ON_SimpleArray<ON_3fPoint>);
      if (iVar3 == boolHasVertexNormalsAsInt) {
        if (boolHasVertexNormalsAsInt < 0xffff) {
          face_count = 0;
          while ((face_count < boolHasTexCoordsAsInt &&
                 (bVar2 = ReadShort(this,4,(ON__UINT16 *)((long)&f + 4)), bVar2))) {
            abcd_1._8_8_ = ON_SimpleArray<ON_MeshFace>::AppendNew(&_tcode->m_F);
            ((ON_MeshFace *)abcd_1._8_8_)->vi[0] = (uint)f._4_2_;
            ((ON_MeshFace *)abcd_1._8_8_)->vi[1] = (uint)f._6_2_;
            ((ON_MeshFace *)abcd_1._8_8_)->vi[2] = (uint)local_e8;
            ((ON_MeshFace *)abcd_1._8_8_)->vi[3] = (uint)local_e6;
            face_count = face_count + 1;
          }
        }
        else {
          face_count = 0;
          while ((face_count < boolHasTexCoordsAsInt &&
                 (bVar2 = ReadInt(this,4,(ON__INT32 *)&f_1), bVar2))) {
            register0x00000000 = ON_SimpleArray<ON_MeshFace>::AppendNew(&_tcode->m_F);
            register0x00000000->vi[0] = (int)f_1;
            register0x00000000->vi[1] = f_1._4_4_;
            register0x00000000->vi[2] = abcd_1[0];
            register0x00000000->vi[3] = abcd_1[1];
            face_count = face_count + 1;
          }
        }
        iVar3 = ON_SimpleArray<ON_MeshFace>::Count(&_tcode->m_F);
        if (iVar3 == boolHasTexCoordsAsInt) {
          if (bVar1) {
            face_count = 0;
            while ((face_count < boolHasVertexNormalsAsInt &&
                   (bVar1 = ReadChar(this,3,(char *)((long)&normal.y + 1)), bVar1))) {
              t.y = (float)(int)normal.y._1_1_ / 127.0;
              normal.x = (float)(int)normal.y._3_1_ / 127.0;
              ON_SimpleArray<ON_3fVector>::Append
                        (&(_tcode->m_N).super_ON_SimpleArray<ON_3fVector>,(ON_3fVector *)&t.y);
              face_count = face_count + 1;
            }
            iVar3 = ON_SimpleArray<ON_3fVector>::Count
                              (&(_tcode->m_N).super_ON_SimpleArray<ON_3fVector>);
            iVar4 = ON_SimpleArray<ON_3fPoint>::Count
                              (&(_tcode->m_V).super_ON_SimpleArray<ON_3fPoint>);
            if (iVar3 != iVar4) goto LAB_004af51b;
          }
          if (bHasTextureCoordinates) {
            face_count = 0;
            while ((face_count < boolHasVertexNormalsAsInt &&
                   (bVar1 = ReadShort(this,2,(ON__UINT16 *)&t), bVar1))) {
              local_12c = (float)t.x._0_2_ / 65535.0;
              fStack_128 = (float)t.x._2_2_ / 65535.0;
              ON_SimpleArray<ON_2fPoint>::Append
                        (&(_tcode->m_T).super_ON_SimpleArray<ON_2fPoint>,
                         (ON_2fPoint *)&stack0xfffffffffffffed4);
              face_count = face_count + 1;
            }
            iVar3 = ON_SimpleArray<ON_2fPoint>::Count
                              (&(_tcode->m_T).super_ON_SimpleArray<ON_2fPoint>);
            iVar4 = ON_SimpleArray<ON_3fPoint>::Count
                              (&(_tcode->m_V).super_ON_SimpleArray<ON_3fPoint>);
            if (iVar3 != iVar4) goto LAB_004af51b;
          }
          big_value._7_1_ = 1;
        }
      }
    }
  }
LAB_004af51b:
  bVar1 = EndRead3dmChunk(this);
  if (!bVar1) {
    big_value._7_1_ = 0;
  }
  if (((big_value._7_1_ & 1) == 0) || (_tcode == (ON_Mesh *)0x0)) {
    if ((_tcode != (ON_Mesh *)0x0) && (_tcode != (ON_Mesh *)0x0)) {
      (*(_tcode->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
    }
    big_value._7_1_ = 0;
  }
  else {
    (pAttributes_local->super_ON_Object)._vptr_ON_Object = (_func_int **)_tcode;
  }
  if (((big_value._7_1_ & 1) != 0) && (_tcode != (ON_Mesh *)0x0)) {
    local_12d = false;
    Read3dmV1AttributesOrMaterial
              (this,(ON_3dmObjectAttributes *)mesh,(ON_Material *)0x0,&local_12d,0xffffffff,
               (ON__3dmV1_XDATA *)0x0);
  }
  return (bool)(big_value._7_1_ & 1);
}

Assistant:

bool ON_BinaryArchive::ReadV1_TCODE_MESH_OBJECT(
                                                ON_Object** ppObject,
                                                ON_3dmObjectAttributes* pAttributes
                                                )
{
  ON_Mesh* mesh = 0;
  bool rc = false;
  // read v1 mesh
  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  int i;
  if ( !BeginRead3dmBigChunk(&tcode,&big_value) )
    return false;
  
  if ( tcode == TCODE_COMPRESSED_MESH_GEOMETRY ) for(;;) 
  {
    
    int point_count = 0;
    int face_count = 0;
    int boolHasVertexNormalsAsInt = false;
    int boolHasTexCoordsAsInt = false;
    ON_BoundingBox bbox;
    
    if (!ReadInt(&point_count) )
      break;
    if ( point_count <= 0 )
      break;
    if (!ReadInt(&face_count) )
      break;
    if ( face_count <= 0 )
      break;
    if (!ReadInt(&boolHasVertexNormalsAsInt) )
      break;
    if (!ReadInt(&boolHasTexCoordsAsInt) )
      break;
    if ( !ReadPoint(bbox.m_min) )
      break;
    if ( !ReadPoint(bbox.m_max) )
      break;

    const bool bHasVertexNormals = boolHasVertexNormalsAsInt ? true : false;
    const bool bHasTexCoords = boolHasTexCoordsAsInt ? true : false;

    mesh = new ON_Mesh(face_count,
                       point_count,
                       bHasVertexNormals,
                       bHasTexCoords
                       );

    // read 3d vertex locations
    {
      ON_3dVector d = bbox.Diagonal();
      double dx = d.x / 65535.0;
      double dy = d.y / 65535.0;
      double dz = d.z / 65535.0;
      unsigned short xyz[3];
      ON_3fPoint pt;
      for ( i = 0; i < point_count; i++ ) {
        if ( !ReadShort(3,xyz) )
          break;
        pt.x = (float)(dx*xyz[0] + bbox.m_min.x);
        pt.y = (float)(dy*xyz[1] + bbox.m_min.y);
        pt.z = (float)(dz*xyz[2] + bbox.m_min.z);
        mesh->m_V.Append(pt);
      }
    }
    if ( mesh->m_V.Count() != point_count )
      break;

    // read triangle/quadrangle faces
    if ( point_count < 65535 ) {
      unsigned short abcd[4];
      for ( i = 0; i < face_count; i++ ) {
        if ( !ReadShort(4,abcd) )
          break;
        ON_MeshFace& f = mesh->m_F.AppendNew();
        f.vi[0] = abcd[0];
        f.vi[1] = abcd[1];
        f.vi[2] = abcd[2];
        f.vi[3] = abcd[3];
      }
    }
    else {
      int abcd[4];
      for ( i = 0; i < face_count; i++ ) {
        if ( !ReadInt(4,abcd) )
          break;
        ON_MeshFace& f = mesh->m_F.AppendNew();
        f.vi[0] = abcd[0];
        f.vi[1] = abcd[1];
        f.vi[2] = abcd[2];
        f.vi[3] = abcd[3];
      }
    }
    if ( mesh->m_F.Count() != face_count )
      break;

    if ( bHasVertexNormals ) {
      char xyz[3];
      ON_3fVector normal;
      for ( i = 0; i < point_count; i++ ) {
        if ( !ReadChar(3,xyz) )
          break;
        normal.x = (float)(((signed char)xyz[0])/127.0);
        normal.y = (float)(((signed char)xyz[1])/127.0);
        normal.z = (float)(((signed char)xyz[2])/127.0);
        mesh->m_N.Append(normal);
      }
      if ( mesh->m_N.Count() != mesh->m_V.Count() )
        break;
    }

    if ( bHasTexCoords ) {
      unsigned short uv[2];
      ON_2fPoint t;
      for ( i = 0; i < point_count; i++ ) {
        if ( !ReadShort(2,uv) )
          break;
        t.x = (float)(uv[0]/65535.0);
        t.y = (float)(uv[1]/65535.0);
        mesh->m_T.Append(t);
      }
      if ( mesh->m_T.Count() != mesh->m_V.Count() )
        break;
    }

    rc = true;

    break;
  }
  
  if ( !EndRead3dmChunk() )
    rc = false;

  if ( rc && mesh ) {
    *ppObject = mesh;
  }
  else {
    if ( mesh )
      delete mesh;
    rc = false;
  }

  if ( rc && mesh ) {
    // attributes and material information follows the TCODE_COMPRESSED_MESH_GEOMETRY chunk;
    bool bHaveMat = false;
    Read3dmV1AttributesOrMaterial(pAttributes,nullptr,bHaveMat,TCODE_ENDOFTABLE);
  }

  return rc;
}